

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::getInstanceDetails
          (BeagleCPUImpl<double,_1,_0> *this,BeagleInstanceDetails *returnInfo)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (returnInfo != (BeagleInstanceDetails *)0x0) {
    returnInfo->resourceNumber = 0;
    iVar1 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x33])();
    returnInfo->flags = CONCAT44(extraout_var,iVar1) | this->kFlags;
    iVar1 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x32])(this);
    returnInfo->implName = (char *)CONCAT44(extraout_var_00,iVar1);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getInstanceDetails(BeagleInstanceDetails* returnInfo) {
    if (returnInfo != NULL) {
        returnInfo->resourceNumber = 0;
        returnInfo->flags = getFlags();
        returnInfo->flags |= kFlags;

        returnInfo->implName = (char*) getName();
    }

    return BEAGLE_SUCCESS;
}